

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cpp
# Opt level: O2

double __thiscall blc::math::Float::calculate(Float *this)

{
  uint uVar1;
  double dVar2;
  
  dVar2 = this->_nb;
  for (uVar1 = this->_E; uVar1 != 0; uVar1 = uVar1 + ((int)~uVar1 >> 0x1f | 1U)) {
    if ((int)uVar1 < 0) {
      dVar2 = dVar2 / 10.0;
    }
    else {
      dVar2 = dVar2 * 10.0;
    }
  }
  return dVar2;
}

Assistant:

double blc::math::Float::calculate() const {
	int	tmp = this->_E;
	double	ret = this->_nb;

	while (tmp != 0) {
		if (tmp < 0) {
			ret /= 10;
			tmp++;
		} else {
			ret *= 10;
			tmp--;
		}
	}
	return (ret);
}